

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_automaticIdAllItemsAllDuplicated_Test::TestBody
          (Annotator_automaticIdAllItemsAllDuplicated_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  char *pcVar5;
  AssertHelper local_12f8 [8];
  Message local_12f0 [8];
  shared_ptr<libcellml::Variable> local_12e8;
  shared_ptr<libcellml::Variable> local_12d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12c8;
  undefined1 local_12a8 [8];
  AssertionResult gtest_ar_39;
  Message local_1290 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1288;
  undefined1 local_1268 [8];
  AssertionResult gtest_ar_38;
  Message local_1250 [8];
  shared_ptr<libcellml::Variable> local_1248;
  shared_ptr<libcellml::Variable> local_1238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1228;
  undefined1 local_1208 [8];
  AssertionResult gtest_ar_37;
  Message local_11f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11e8;
  undefined1 local_11c8 [8];
  AssertionResult gtest_ar_36;
  VariablePairPtr *itemMapVariables2;
  VariablePairPtr *itemConnection2;
  string local_11a0 [39];
  allocator<char> local_1179;
  string local_1178 [32];
  shared_ptr<libcellml::Component> local_1158;
  shared_ptr<libcellml::Variable> local_1148;
  allocator<char> local_1131;
  string local_1130 [39];
  allocator<char> local_1109;
  string local_1108 [32];
  shared_ptr<libcellml::Component> local_10e8;
  shared_ptr<libcellml::Variable> local_10d8;
  shared_ptr local_10c8 [16];
  undefined1 local_10b8 [8];
  VariablePairPtr mapping2;
  string local_10a0 [39];
  allocator<char> local_1079;
  string local_1078 [32];
  shared_ptr<libcellml::Component> local_1058;
  shared_ptr<libcellml::Variable> local_1048;
  allocator<char> local_1031;
  string local_1030 [39];
  allocator<char> local_1009;
  string local_1008 [32];
  shared_ptr<libcellml::Component> local_fe8;
  shared_ptr<libcellml::Variable> local_fd8;
  shared_ptr local_fc8 [16];
  undefined1 local_fb8 [8];
  VariablePairPtr connection2;
  Message local_fa0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f98;
  undefined1 local_f78 [8];
  AssertionResult gtest_ar_35;
  Message local_f60 [15];
  allocator<char> local_f51;
  string local_f50 [32];
  shared_ptr<libcellml::Component> local_f30;
  shared_ptr<libcellml::Variable> local_f20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f10;
  undefined1 local_ef0 [8];
  AssertionResult gtest_ar_34;
  Message local_ed8 [8];
  shared_ptr<libcellml::Units> local_ed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ec0;
  undefined1 local_ea0 [8];
  AssertionResult gtest_ar_33;
  Message local_e88 [8];
  shared_ptr<libcellml::Units> local_e80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e70;
  undefined1 local_e50 [8];
  AssertionResult gtest_ar_32;
  Message local_e38 [15];
  allocator<char> local_e29;
  string local_e28 [32];
  shared_ptr<libcellml::Component> local_e08;
  shared_ptr<libcellml::Reset> local_df8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_de8;
  undefined1 local_dc8 [8];
  AssertionResult gtest_ar_31;
  Message local_db0 [15];
  allocator<char> local_da1;
  string local_da0 [32];
  shared_ptr<libcellml::Component> local_d80;
  shared_ptr<libcellml::Reset> local_d70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d60;
  undefined1 local_d40 [8];
  AssertionResult gtest_ar_30;
  Message local_d28 [15];
  allocator<char> local_d19;
  string local_d18 [32];
  shared_ptr<libcellml::Component> local_cf8;
  shared_ptr<libcellml::Reset> local_ce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd8;
  undefined1 local_cb8 [8];
  AssertionResult gtest_ar_29;
  Message local_ca0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c98;
  undefined1 local_c78 [8];
  AssertionResult gtest_ar_28;
  Message local_c60 [8];
  shared_ptr<libcellml::Variable> local_c58;
  shared_ptr<libcellml::Variable> local_c48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c38;
  undefined1 local_c18 [8];
  AssertionResult gtest_ar_27;
  Message local_c00 [15];
  allocator<char> local_bf1;
  string local_bf0 [32];
  shared_ptr<libcellml::Component> local_bd0;
  shared_ptr<libcellml::ImportSource> local_bc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb0;
  undefined1 local_b90 [8];
  AssertionResult gtest_ar_26;
  Message local_b78 [8];
  shared_ptr<libcellml::Variable> local_b70;
  shared_ptr<libcellml::Variable> local_b60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b50;
  undefined1 local_b30 [8];
  AssertionResult gtest_ar_25;
  Message local_b18 [15];
  allocator<char> local_b09;
  string local_b08 [32];
  shared_ptr<libcellml::Component> local_ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  undefined1 local_ab8 [8];
  AssertionResult gtest_ar_24;
  Message local_aa0 [8];
  shared_ptr<libcellml::Component> local_a98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a88;
  undefined1 local_a68 [8];
  AssertionResult gtest_ar_23;
  Message local_a50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  undefined1 local_a28 [8];
  AssertionResult gtest_ar_22;
  Message local_a10 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a08;
  undefined1 local_9e8 [8];
  AssertionResult gtest_ar_21;
  Message local_9d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c8;
  undefined1 local_9a8 [8];
  AssertionResult gtest_ar_20;
  Message local_990 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  undefined1 local_968 [8];
  AssertionResult gtest_ar_19;
  Message local_950 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  undefined1 local_928 [8];
  AssertionResult gtest_ar_18;
  Message local_910 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  undefined1 local_8e8 [8];
  AssertionResult gtest_ar_17;
  Message local_8d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  undefined1 local_8a8 [8];
  AssertionResult gtest_ar_16;
  Message local_890 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  undefined1 local_868 [8];
  AssertionResult gtest_ar_15;
  Message local_850 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  undefined1 local_828 [8];
  AssertionResult gtest_ar_14;
  Message local_810 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  undefined1 local_7e8 [8];
  AssertionResult gtest_ar_13;
  Message local_7d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  undefined1 local_7a8 [8];
  AssertionResult gtest_ar_12;
  Message local_790 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  undefined1 local_768 [8];
  AssertionResult gtest_ar_11;
  Message local_750 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  undefined1 local_728 [8];
  AssertionResult gtest_ar_10;
  Message local_710 [8];
  shared_ptr<const_libcellml::ParentedEntity> local_708;
  shared_ptr<libcellml::Model> local_6f8;
  undefined1 local_6e8 [8];
  AssertionResult gtest_ar_9;
  Message local_6d0 [8];
  shared_ptr<const_libcellml::ParentedEntity> local_6c8;
  shared_ptr<libcellml::Model> local_6b8;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar_8;
  Message local_690 [8];
  shared_ptr<libcellml::Units> local_688;
  shared_ptr<const_libcellml::ParentedEntity> local_678;
  shared_ptr<libcellml::Model> local_668;
  undefined1 local_658 [8];
  AssertionResult gtest_ar_7;
  Message local_640 [8];
  shared_ptr<const_libcellml::ParentedEntity> local_638;
  shared_ptr<libcellml::Model> local_628;
  undefined1 local_618 [8];
  AssertionResult gtest_ar_6;
  Message local_600 [8];
  shared_ptr<const_libcellml::ParentedEntity> local_5f8;
  shared_ptr<libcellml::Model> local_5e8;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar_5;
  Message local_5c0 [8];
  shared_ptr<const_libcellml::ParentedEntity> local_5b8;
  shared_ptr<libcellml::Model> local_5a8;
  undefined1 local_598 [8];
  AssertionResult gtest_ar_4;
  Message local_580 [8];
  shared_ptr<libcellml::Variable> local_578;
  shared_ptr<const_libcellml::ParentedEntity> local_568;
  shared_ptr<libcellml::Model> local_558;
  undefined1 local_548 [8];
  AssertionResult gtest_ar_3;
  Message local_530 [8];
  shared_ptr<libcellml::Variable> local_528;
  shared_ptr<const_libcellml::ParentedEntity> local_518;
  shared_ptr<libcellml::Model> local_508;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_2;
  Message local_4e0 [8];
  shared_ptr<const_libcellml::ParentedEntity> local_4d8;
  shared_ptr<libcellml::Model> local_4c8;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_1;
  Message local_4a0 [8];
  shared_ptr<const_libcellml::ParentedEntity> local_498;
  shared_ptr<libcellml::Model> local_488;
  undefined1 local_478 [8];
  AssertionResult gtest_ar;
  string local_460 [32];
  shared_ptr<libcellml::Component> local_440;
  undefined1 local_430 [8];
  VariablePtr itemVariable;
  UnitsPtr itemUnits;
  shared_ptr<libcellml::UnitsItem> local_400;
  shared_ptr *local_3f0;
  UnitsItemPtr *itemUnitsItem;
  string local_3e0 [32];
  shared_ptr<libcellml::Component> local_3c0;
  undefined1 local_3b0 [8];
  ResetPtr itemTestValue;
  string local_398 [32];
  shared_ptr<libcellml::Component> local_378;
  undefined1 local_368 [8];
  ResetPtr itemResetValue;
  string local_350 [32];
  shared_ptr<libcellml::Component> local_330;
  undefined1 local_320 [8];
  ResetPtr itemReset;
  ModelPtr itemModel;
  VariablePairPtr *itemMapVariables;
  string local_2f0 [32];
  shared_ptr<libcellml::Component> local_2d0;
  undefined1 local_2c0 [8];
  ImportSourcePtr itemImportSource;
  ModelPtr itemEncapsulation;
  VariablePairPtr *itemConnection;
  string local_290 [32];
  undefined1 local_270 [8];
  ComponentPtr itemComponentEncapsulation;
  ComponentPtr itemComponent;
  string local_248 [39];
  allocator<char> local_221;
  string local_220 [32];
  shared_ptr<libcellml::Component> local_200;
  shared_ptr<libcellml::Variable> local_1f0;
  shared_ptr<libcellml::Variable> local_1e0;
  allocator<char> local_1c9;
  string local_1c8 [39];
  allocator<char> local_1a1;
  string local_1a0 [32];
  shared_ptr<libcellml::Component> local_180;
  string local_170 [16];
  undefined1 local_160 [8];
  VariablePairPtr mapping;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [32];
  shared_ptr<libcellml::Component> local_100;
  shared_ptr<libcellml::Variable> local_f0;
  shared_ptr<libcellml::Variable> local_e0;
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [32];
  shared_ptr<libcellml::Component> local_80;
  string local_70 [16];
  undefined1 local_60 [8];
  VariablePairPtr connection;
  AnnotatorPtr annotator;
  undefined1 local_30 [8];
  ModelPtr model;
  ParserPtr parser;
  Annotator_automaticIdAllItemsAllDuplicated_Test *this_local;
  
  p_Var1 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(p_Var1,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             p_Var1);
  libcellml::Parser::parseModel((string *)local_30);
  libcellml::Annotator::create();
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"component2",&local_a1);
  libcellml::ComponentEntity::component((string *)&local_80,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"variable1",&local_c9);
  libcellml::Component::variable(local_70);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"component2",&local_121);
  libcellml::ComponentEntity::component((string *)&local_100,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"variable1",
             (allocator<char> *)
             ((long)&mapping.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  libcellml::Component::variable((string *)&local_f0);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_f0);
  libcellml::Variable::equivalentVariable((ulong)&local_e0);
  libcellml::VariablePair::create((shared_ptr *)local_60,(shared_ptr *)local_70);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_e0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_f0);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&mapping.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_100);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_70);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"component2",&local_1a1);
  libcellml::ComponentEntity::component((string *)&local_180,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,"variable2",&local_1c9);
  libcellml::Component::variable(local_170);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_220,"component2",&local_221);
  libcellml::ComponentEntity::component((string *)&local_200,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_248,"variable2",
             (allocator<char> *)
             ((long)&itemComponent.
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::variable((string *)&local_1f0);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1f0);
  libcellml::Variable::equivalentVariable((ulong)&local_1e0);
  libcellml::VariablePair::create((shared_ptr *)local_160,(shared_ptr *)local_170);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1e0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1f0);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&itemComponent.
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_200);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_170);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_180);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::ComponentEntity::component
            ((ulong)&itemComponentEncapsulation.
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_290,"component2",(allocator<char> *)((long)&itemConnection + 7));
  libcellml::ComponentEntity::component((string *)local_270,SUB81(peVar3,0));
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)((long)&itemConnection + 7));
  std::shared_ptr<libcellml::Model>::shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &itemImportSource.
              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<libcellml::Model> *)local_30);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2f0,"component1",(allocator<char> *)((long)&itemMapVariables + 7));
  libcellml::ComponentEntity::component((string *)&local_2d0,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_2d0);
  libcellml::ImportedEntity::importSource();
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_2d0);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&itemMapVariables + 7));
  std::shared_ptr<libcellml::Model>::shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &itemReset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(shared_ptr<libcellml::Model> *)local_30);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_350,"component2",
             (allocator<char> *)
             ((long)&itemResetValue.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  libcellml::ComponentEntity::component((string *)&local_330,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_330);
  libcellml::Component::reset((ulong)local_320);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_330);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&itemResetValue.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_398,"component2",
             (allocator<char> *)
             ((long)&itemTestValue.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ComponentEntity::component((string *)&local_378,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_378);
  libcellml::Component::reset((ulong)local_368);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_378);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&itemTestValue.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3e0,"component2",(allocator<char> *)((long)&itemUnitsItem + 7));
  libcellml::ComponentEntity::component((string *)&local_3c0,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_3c0);
  libcellml::Component::reset((ulong)local_3b0);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_3c0);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&itemUnitsItem + 7));
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Model::units
            ((ulong)&itemUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  p_Var1 = &itemUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::UnitsItem::create((shared_ptr *)&local_400,(ulong)p_Var1);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)p_Var1);
  local_3f0 = (shared_ptr *)&local_400;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Model::units
            ((ulong)&itemVariable.
                     super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_460,"component2",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  libcellml::ComponentEntity::component((string *)&local_440,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_440);
  libcellml::Component::variable((ulong)local_430);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_440);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::setModel((shared_ptr *)peVar4);
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Component,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_498,
             (shared_ptr<libcellml::Component> *)
             &itemComponentEncapsulation.
              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  owningModel((shared_ptr *)&local_488);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_478,"model","owningModel(itemComponent)",
             (shared_ptr<libcellml::Model> *)local_30,&local_488);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_488);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_498);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar2) {
    testing::Message::Message(local_4a0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x54d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_4a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Component,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_4d8,
             (shared_ptr<libcellml::Component> *)local_270);
  owningModel((shared_ptr *)&local_4c8);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_4b8,"model","owningModel(itemComponentEncapsulation)",
             (shared_ptr<libcellml::Model> *)local_30,&local_4c8);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_4c8);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_4d8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar2) {
    testing::Message::Message(local_4e0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x54e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_4e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_60);
  libcellml::VariablePair::variable1();
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Variable,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_518,&local_528);
  owningModel((shared_ptr *)&local_508);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_4f8,"model","owningModel(itemConnection->variable1())",
             (shared_ptr<libcellml::Model> *)local_30,&local_508);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_508);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_518);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_528);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar2) {
    testing::Message::Message(local_530);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_4f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x54f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_530);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_530);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_160);
  libcellml::VariablePair::variable1();
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Variable,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_568,&local_578);
  owningModel((shared_ptr *)&local_558);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_548,"model","owningModel(itemMapVariables->variable1())",
             (shared_ptr<libcellml::Model> *)local_30,&local_558);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_558);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_568);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_578);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar2) {
    testing::Message::Message(local_580);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_548);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x550,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_580);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Reset,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_5b8,
             (shared_ptr<libcellml::Reset> *)local_320);
  owningModel((shared_ptr *)&local_5a8);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_598,"model","owningModel(itemReset)",
             (shared_ptr<libcellml::Model> *)local_30,&local_5a8);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_5a8);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_5b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_598);
  if (!bVar2) {
    testing::Message::Message(local_5c0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_598);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x551,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_5c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_598);
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Reset,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_5f8,
             (shared_ptr<libcellml::Reset> *)local_368);
  owningModel((shared_ptr *)&local_5e8);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_5d8,"model","owningModel(itemResetValue)",
             (shared_ptr<libcellml::Model> *)local_30,&local_5e8);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_5e8);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_5f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
  if (!bVar2) {
    testing::Message::Message(local_600);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_5d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x552,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_600);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Reset,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_638,
             (shared_ptr<libcellml::Reset> *)local_3b0);
  owningModel((shared_ptr *)&local_628);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_618,"model","owningModel(itemTestValue)",
             (shared_ptr<libcellml::Model> *)local_30,&local_628);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_628);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_638);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
  if (!bVar2) {
    testing::Message::Message(local_640);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_618);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x553,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_640);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(local_640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
  std::__shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_3f0);
  libcellml::UnitsItem::units();
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Units,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_678,&local_688);
  owningModel((shared_ptr *)&local_668);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_658,"model","owningModel(itemUnitsItem->units())",
             (shared_ptr<libcellml::Model> *)local_30,&local_668);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_668);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_678);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_688);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_658);
  if (!bVar2) {
    testing::Message::Message(local_690);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_658);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x554,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_690);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_658);
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Units,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_6c8,
             (shared_ptr<libcellml::Units> *)
             &itemVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  owningModel((shared_ptr *)&local_6b8);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_6a8,"model","owningModel(itemUnits)",
             (shared_ptr<libcellml::Model> *)local_30,&local_6b8);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_6b8);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_6c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar2) {
    testing::Message::Message(local_6d0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_6a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x555,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,local_6d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(local_6d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Variable,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_708,
             (shared_ptr<libcellml::Variable> *)local_430);
  owningModel((shared_ptr *)&local_6f8);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_6e8,"model","owningModel(itemVariable)",
             (shared_ptr<libcellml::Model> *)local_30,&local_6f8);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_6f8);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_708);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e8);
  if (!bVar2) {
    testing::Message::Message(local_710);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_6e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x556,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,local_710);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(local_710);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e8);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_748,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_728,"\"b4da55\"","annotator->assignId(itemComponent)",
             (char (*) [7])"b4da55",&local_748);
  std::__cxx11::string::~string((string *)&local_748);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_728);
  if (!bVar2) {
    testing::Message::Message(local_750);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_728);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x559,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,local_750);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(local_750);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_728);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_788,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_768,"\"b4da56\"",
             "annotator->assignId(itemComponentEncapsulation, libcellml::CellmlElementType::COMPONENT_REF)"
             ,(char (*) [7])"b4da56",&local_788);
  std::__cxx11::string::~string((string *)&local_788);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_768);
  if (!bVar2) {
    testing::Message::Message(local_790);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_768);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x55a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,local_790);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(local_790);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_768);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_7c8,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_7a8,"\"b4da57\"",
             "annotator->assignId(itemConnection, libcellml::CellmlElementType::CONNECTION)",
             (char (*) [7])"b4da57",&local_7c8);
  std::__cxx11::string::~string((string *)&local_7c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a8);
  if (!bVar2) {
    testing::Message::Message(local_7d0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_7a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x55b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,local_7d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a8);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &connection.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_808);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_7e8,"\"b4da58\"","annotator->assignId(itemImportSource)",
             (char (*) [7])"b4da58",&local_808);
  std::__cxx11::string::~string((string *)&local_808);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
  if (!bVar2) {
    testing::Message::Message(local_810);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_7e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x55c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,local_810);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(local_810);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_848,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_828,"\"b4da59\"","annotator->assignId(itemMapVariables)",
             (char (*) [7])"b4da59",&local_848);
  std::__cxx11::string::~string((string *)&local_848);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_828);
  if (!bVar2) {
    testing::Message::Message(local_850);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_828);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x55d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,local_850);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(local_850);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_828);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_888,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_868,"\"b4da5a\"","annotator->assignId(itemModel)",
             (char (*) [7])"b4da5a",&local_888);
  std::__cxx11::string::~string((string *)&local_888);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
  if (!bVar2) {
    testing::Message::Message(local_890);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_868);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x55e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,local_890);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(local_890);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_868);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_8c8,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_8a8,"\"b4da5b\"","annotator->assignId(itemReset)",
             (char (*) [7])"b4da5b",&local_8c8);
  std::__cxx11::string::~string((string *)&local_8c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a8);
  if (!bVar2) {
    testing::Message::Message(local_8d0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_8a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x55f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,local_8d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(local_8d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a8);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_908,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_8e8,"\"b4da5c\"",
             "annotator->assignId(itemResetValue, libcellml::CellmlElementType::RESET_VALUE)",
             (char (*) [7])"b4da5c",&local_908);
  std::__cxx11::string::~string((string *)&local_908);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e8);
  if (!bVar2) {
    testing::Message::Message(local_910);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_8e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x560,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,local_910);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(local_910);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e8);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_948,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_928,"\"b4da5d\"",
             "annotator->assignId(itemTestValue, libcellml::CellmlElementType::TEST_VALUE)",
             (char (*) [7])"b4da5d",&local_948);
  std::__cxx11::string::~string((string *)&local_948);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_928);
  if (!bVar2) {
    testing::Message::Message(local_950);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_928);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x561,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,local_950);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(local_950);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_928);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &connection.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_988);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_968,"\"b4da5e\"","annotator->assignId(itemUnitsItem)",
             (char (*) [7])"b4da5e",&local_988);
  std::__cxx11::string::~string((string *)&local_988);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_968);
  if (!bVar2) {
    testing::Message::Message(local_990);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_968);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x562,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,local_990);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(local_990);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_968);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &connection.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_9c8);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_9a8,"\"b4da5f\"","annotator->assignId(itemUnits)",
             (char (*) [7])"b4da5f",&local_9c8);
  std::__cxx11::string::~string((string *)&local_9c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a8);
  if (!bVar2) {
    testing::Message::Message(local_9d0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_9a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x563,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,local_9d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(local_9d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a8);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &connection.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_a08);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_9e8,"\"b4da60\"","annotator->assignId(itemVariable)",
             (char (*) [7])"b4da60",&local_a08);
  std::__cxx11::string::~string((string *)&local_a08);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e8);
  if (!bVar2) {
    testing::Message::Message(local_a10);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_9e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x564,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,local_a10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(local_a10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e8);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_a48,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_a28,"\"b4da61\"",
             "annotator->assignId(itemEncapsulation, libcellml::CellmlElementType::ENCAPSULATION)",
             (char (*) [7])"b4da61",&local_a48);
  std::__cxx11::string::~string((string *)&local_a48);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a28);
  if (!bVar2) {
    testing::Message::Message(local_a50);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_a28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x565,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,local_a50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(local_a50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a28);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::ComponentEntity::component((ulong)&local_a98);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_a98);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_a68,"\"b4da55\"","model->component(0)->id()",
             (char (*) [7])"b4da55",&local_a88);
  std::__cxx11::string::~string((string *)&local_a88);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_a98);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a68);
  if (!bVar2) {
    testing::Message::Message(local_aa0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_a68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x567,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,local_aa0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(local_aa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a68);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b08,"component2",&local_b09);
  libcellml::ComponentEntity::component((string *)&local_ae8,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_ae8);
  libcellml::ComponentEntity::encapsulationId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_ab8,"\"b4da56\"",
             "model->component(\"component2\")->encapsulationId()",(char (*) [7])"b4da56",&local_ad8
            );
  std::__cxx11::string::~string((string *)&local_ad8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_ae8);
  std::__cxx11::string::~string(local_b08);
  std::allocator<char>::~allocator(&local_b09);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ab8);
  if (!bVar2) {
    testing::Message::Message(local_b18);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_ab8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x568,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,local_b18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(local_b18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ab8);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_60);
  libcellml::VariablePair::variable1();
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_60);
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_
            ((shared_ptr *)&local_b50,(shared_ptr *)&local_b60);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_b30,"\"b4da57\"",
             "libcellml::Variable::equivalenceConnectionId(connection->variable1(), connection->variable2())"
             ,(char (*) [7])"b4da57",&local_b50);
  std::__cxx11::string::~string((string *)&local_b50);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_b70);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_b60);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b30);
  if (!bVar2) {
    testing::Message::Message(local_b78);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_b30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x569,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,local_b78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(local_b78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b30);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_bf0,"component1",&local_bf1);
  libcellml::ComponentEntity::component((string *)&local_bd0,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_bd0);
  libcellml::ImportedEntity::importSource();
  std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&local_bc0);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_b90,"\"b4da58\"",
             "model->component(\"component1\")->importSource()->id()",(char (*) [7])"b4da58",
             &local_bb0);
  std::__cxx11::string::~string((string *)&local_bb0);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_bc0);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_bd0);
  std::__cxx11::string::~string(local_bf0);
  std::allocator<char>::~allocator(&local_bf1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b90);
  if (!bVar2) {
    testing::Message::Message(local_c00);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_b90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x56a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,local_c00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(local_c00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b90);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_160);
  libcellml::VariablePair::variable1();
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_160);
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceMappingId_abi_cxx11_
            ((shared_ptr *)&local_c38,(shared_ptr *)&local_c48);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_c18,"\"b4da59\"",
             "libcellml::Variable::equivalenceMappingId(mapping->variable1(), mapping->variable2())"
             ,(char (*) [7])"b4da59",&local_c38);
  std::__cxx11::string::~string((string *)&local_c38);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_c58);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_c48);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c18);
  if (!bVar2) {
    testing::Message::Message(local_c60);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_c18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x56b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,local_c60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(local_c60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c18);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_c78,"\"b4da5a\"","model->id()",(char (*) [7])"b4da5a",
             &local_c98);
  std::__cxx11::string::~string((string *)&local_c98);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c78);
  if (!bVar2) {
    testing::Message::Message(local_ca0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_c78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x56c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,local_ca0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(local_ca0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c78);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d18,"component2",&local_d19);
  libcellml::ComponentEntity::component((string *)&local_cf8,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_cf8);
  libcellml::Component::reset((ulong)&local_ce8);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_ce8);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_cb8,"\"b4da5b\"",
             "model->component(\"component2\")->reset(0)->id()",(char (*) [7])"b4da5b",&local_cd8);
  std::__cxx11::string::~string((string *)&local_cd8);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_ce8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_cf8);
  std::__cxx11::string::~string(local_d18);
  std::allocator<char>::~allocator(&local_d19);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cb8);
  if (!bVar2) {
    testing::Message::Message(local_d28);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_cb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x56d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,local_d28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(local_d28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cb8);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_da0,"component2",&local_da1);
  libcellml::ComponentEntity::component((string *)&local_d80,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_d80);
  libcellml::Component::reset((ulong)&local_d70);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_d70);
  libcellml::Reset::resetValueId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_d40,"\"b4da5c\"",
             "model->component(\"component2\")->reset(0)->resetValueId()",(char (*) [7])"b4da5c",
             &local_d60);
  std::__cxx11::string::~string((string *)&local_d60);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_d70);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_d80);
  std::__cxx11::string::~string(local_da0);
  std::allocator<char>::~allocator(&local_da1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d40);
  if (!bVar2) {
    testing::Message::Message(local_db0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_d40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x56e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,local_db0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(local_db0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d40);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e28,"component2",&local_e29);
  libcellml::ComponentEntity::component((string *)&local_e08,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_e08);
  libcellml::Component::reset((ulong)&local_df8);
  std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_df8);
  libcellml::Reset::testValueId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_dc8,"\"b4da5d\"",
             "model->component(\"component2\")->reset(0)->testValueId()",(char (*) [7])"b4da5d",
             &local_de8);
  std::__cxx11::string::~string((string *)&local_de8);
  std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_df8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_e08);
  std::__cxx11::string::~string(local_e28);
  std::allocator<char>::~allocator(&local_e29);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dc8);
  if (!bVar2) {
    testing::Message::Message(local_e38);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_dc8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x56f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,local_e38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(local_e38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dc8);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Model::units((ulong)&local_e80);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_e80);
  libcellml::Units::unitId_abi_cxx11_((ulong)&local_e70);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_e50,"\"b4da5e\"","model->units(1)->unitId(0)",
             (char (*) [7])"b4da5e",&local_e70);
  std::__cxx11::string::~string((string *)&local_e70);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_e80);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e50);
  if (!bVar2) {
    testing::Message::Message(local_e88);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_e50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x570,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,local_e88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(local_e88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e50);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Model::units((ulong)&local_ed0);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_ed0);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_ea0,"\"b4da5f\"","model->units(1)->id()",
             (char (*) [7])"b4da5f",&local_ec0);
  std::__cxx11::string::~string((string *)&local_ec0);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_ed0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ea0);
  if (!bVar2) {
    testing::Message::Message(local_ed8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_ea0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x571,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,local_ed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(local_ed8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ea0);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f50,"component2",&local_f51);
  libcellml::ComponentEntity::component((string *)&local_f30,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_f30);
  libcellml::Component::variable((ulong)&local_f20);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_f20);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_ef0,"\"b4da60\"",
             "model->component(\"component2\")->variable(0)->id()",(char (*) [7])"b4da60",&local_f10
            );
  std::__cxx11::string::~string((string *)&local_f10);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_f20);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_f30);
  std::__cxx11::string::~string(local_f50);
  std::allocator<char>::~allocator(&local_f51);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ef0);
  if (!bVar2) {
    testing::Message::Message(local_f60);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_ef0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x572,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,local_f60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(local_f60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ef0);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::ComponentEntity::encapsulationId_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_f78,"\"b4da61\"","model->encapsulationId()",
             (char (*) [7])"b4da61",&local_f98);
  std::__cxx11::string::~string((string *)&local_f98);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f78);
  if (!bVar2) {
    testing::Message::Message(local_fa0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_f78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &connection2.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x573,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &connection2.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_fa0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &connection2.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_fa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f78);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1008,"component2",&local_1009);
  libcellml::ComponentEntity::component((string *)&local_fe8,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_fe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1030,"variable1",&local_1031);
  libcellml::Component::variable((string *)&local_fd8);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_fd8);
  libcellml::Variable::equivalentVariable((ulong)local_fc8);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1078,"component2",&local_1079);
  libcellml::ComponentEntity::component((string *)&local_1058,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_10a0,"variable1",
             (allocator<char> *)
             ((long)&mapping2.
                     super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::variable((string *)&local_1048);
  libcellml::VariablePair::create((shared_ptr *)local_fb8,local_fc8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1048);
  std::__cxx11::string::~string(local_10a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&mapping2.
                     super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_1058);
  std::__cxx11::string::~string(local_1078);
  std::allocator<char>::~allocator(&local_1079);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_fc8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_fd8);
  std::__cxx11::string::~string(local_1030);
  std::allocator<char>::~allocator(&local_1031);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_fe8);
  std::__cxx11::string::~string(local_1008);
  std::allocator<char>::~allocator(&local_1009);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1108,"component4",&local_1109);
  libcellml::ComponentEntity::component((string *)&local_10e8,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_10e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1130,"variable2",&local_1131);
  libcellml::Component::variable((string *)&local_10d8);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_10d8);
  libcellml::Variable::equivalentVariable((ulong)local_10c8);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1178,"component4",&local_1179);
  libcellml::ComponentEntity::component((string *)&local_1158,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_11a0,"variable2",(allocator<char> *)((long)&itemConnection2 + 7));
  libcellml::Component::variable((string *)&local_1148);
  libcellml::VariablePair::create((shared_ptr *)local_10b8,local_10c8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1148);
  std::__cxx11::string::~string(local_11a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&itemConnection2 + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_1158);
  std::__cxx11::string::~string(local_1178);
  std::allocator<char>::~allocator(&local_1179);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_10c8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_10d8);
  std::__cxx11::string::~string(local_1130);
  std::allocator<char>::~allocator(&local_1131);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_10e8);
  std::__cxx11::string::~string(local_1108);
  std::allocator<char>::~allocator(&local_1109);
  gtest_ar_36.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10b8;
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_11e8,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_11c8,"\"b4da62\"",
             "annotator->assignId(itemConnection2, libcellml::CellmlElementType::CONNECTION)",
             (char (*) [7])"b4da62",&local_11e8);
  std::__cxx11::string::~string((string *)&local_11e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11c8);
  if (!bVar2) {
    testing::Message::Message(local_11f0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_11c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x57f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,local_11f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(local_11f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11c8);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_fb8);
  libcellml::VariablePair::variable1();
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_fb8);
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_
            ((shared_ptr *)&local_1228,(shared_ptr *)&local_1238);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_1208,"\"b4da62\"",
             "libcellml::Variable::equivalenceConnectionId(connection2->variable1(), connection2->variable2())"
             ,(char (*) [7])"b4da62",&local_1228);
  std::__cxx11::string::~string((string *)&local_1228);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1248);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1238);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1208);
  if (!bVar2) {
    testing::Message::Message(local_1250);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x580,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_38.message_,local_1250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
    testing::Message::~Message(local_1250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1208);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&connection.
                            super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_1288,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_1268,"\"b4da63\"","annotator->assignId(itemMapVariables2)",
             (char (*) [7])"b4da63",&local_1288);
  std::__cxx11::string::~string((string *)&local_1288);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1268);
  if (!bVar2) {
    testing::Message::Message(local_1290);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x582,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,local_1290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
    testing::Message::~Message(local_1290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1268);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_10b8);
  libcellml::VariablePair::variable1();
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_10b8);
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceMappingId_abi_cxx11_
            ((shared_ptr *)&local_12c8,(shared_ptr *)&local_12d8);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_12a8,"\"b4da63\"",
             "libcellml::Variable::equivalenceMappingId(mapping2->variable1(), mapping2->variable2())"
             ,(char (*) [7])"b4da63",&local_12c8);
  std::__cxx11::string::~string((string *)&local_12c8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_12e8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_12d8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12a8);
  if (!bVar2) {
    testing::Message::Message(local_12f0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_12a8);
    testing::internal::AssertHelper::AssertHelper
              (local_12f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x583,pcVar5);
    testing::internal::AssertHelper::operator=(local_12f8,local_12f0);
    testing::internal::AssertHelper::~AssertHelper(local_12f8);
    testing::Message::~Message(local_12f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12a8);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)local_10b8);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)local_fb8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_430);
  std::shared_ptr<libcellml::Units>::~shared_ptr
            ((shared_ptr<libcellml::Units> *)
             &itemVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::UnitsItem>::~shared_ptr(&local_400);
  std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)local_3b0);
  std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)local_368);
  std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)local_320);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &itemReset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_2c0);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &itemImportSource.
              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_270);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &itemComponentEncapsulation.
              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)local_160);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)local_60);
  std::shared_ptr<libcellml::Annotator>::~shared_ptr
            ((shared_ptr<libcellml::Annotator> *)
             &connection.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Annotator, automaticIdAllItemsAllDuplicated)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringDuplicateIds);
    auto annotator = libcellml::Annotator::create();

    auto connection = libcellml::VariablePair::create(
        model->component("component2")->variable("variable1"),
        model->component("component2")->variable("variable1")->equivalentVariable(0));
    auto mapping = libcellml::VariablePair::create(
        model->component("component2")->variable("variable2"),
        model->component("component2")->variable("variable2")->equivalentVariable(0));

    auto itemComponent = model->component(0);
    auto itemComponentEncapsulation = model->component("component2");
    auto const &itemConnection = connection;
    auto itemEncapsulation = model;
    auto itemImportSource = model->component("component1")->importSource();
    auto const &itemMapVariables = mapping;
    auto itemModel = model;
    auto itemReset = model->component("component2")->reset(0);
    auto itemResetValue = model->component("component2")->reset(0);
    auto itemTestValue = model->component("component2")->reset(0);
    auto const &itemUnitsItem = libcellml::UnitsItem::create(model->units(1), 0);
    auto itemUnits = model->units(1);
    auto itemVariable = model->component("component2")->variable(0);

    annotator->setModel(model);

    EXPECT_EQ(model, owningModel(itemComponent));
    EXPECT_EQ(model, owningModel(itemComponentEncapsulation));
    EXPECT_EQ(model, owningModel(itemConnection->variable1()));
    EXPECT_EQ(model, owningModel(itemMapVariables->variable1()));
    EXPECT_EQ(model, owningModel(itemReset));
    EXPECT_EQ(model, owningModel(itemResetValue));
    EXPECT_EQ(model, owningModel(itemTestValue));
    EXPECT_EQ(model, owningModel(itemUnitsItem->units()));
    EXPECT_EQ(model, owningModel(itemUnits));
    EXPECT_EQ(model, owningModel(itemVariable));

    // Expect each have had a change of identifier.
    EXPECT_EQ("b4da55", annotator->assignId(itemComponent));
    EXPECT_EQ("b4da56", annotator->assignId(itemComponentEncapsulation, libcellml::CellmlElementType::COMPONENT_REF));
    EXPECT_EQ("b4da57", annotator->assignId(itemConnection, libcellml::CellmlElementType::CONNECTION));
    EXPECT_EQ("b4da58", annotator->assignId(itemImportSource));
    EXPECT_EQ("b4da59", annotator->assignId(itemMapVariables));
    EXPECT_EQ("b4da5a", annotator->assignId(itemModel));
    EXPECT_EQ("b4da5b", annotator->assignId(itemReset));
    EXPECT_EQ("b4da5c", annotator->assignId(itemResetValue, libcellml::CellmlElementType::RESET_VALUE));
    EXPECT_EQ("b4da5d", annotator->assignId(itemTestValue, libcellml::CellmlElementType::TEST_VALUE));
    EXPECT_EQ("b4da5e", annotator->assignId(itemUnitsItem));
    EXPECT_EQ("b4da5f", annotator->assignId(itemUnits));
    EXPECT_EQ("b4da60", annotator->assignId(itemVariable));
    EXPECT_EQ("b4da61", annotator->assignId(itemEncapsulation, libcellml::CellmlElementType::ENCAPSULATION));

    EXPECT_EQ("b4da55", model->component(0)->id());
    EXPECT_EQ("b4da56", model->component("component2")->encapsulationId());
    EXPECT_EQ("b4da57", libcellml::Variable::equivalenceConnectionId(connection->variable1(), connection->variable2()));
    EXPECT_EQ("b4da58", model->component("component1")->importSource()->id());
    EXPECT_EQ("b4da59", libcellml::Variable::equivalenceMappingId(mapping->variable1(), mapping->variable2()));
    EXPECT_EQ("b4da5a", model->id());
    EXPECT_EQ("b4da5b", model->component("component2")->reset(0)->id());
    EXPECT_EQ("b4da5c", model->component("component2")->reset(0)->resetValueId());
    EXPECT_EQ("b4da5d", model->component("component2")->reset(0)->testValueId());
    EXPECT_EQ("b4da5e", model->units(1)->unitId(0));
    EXPECT_EQ("b4da5f", model->units(1)->id());
    EXPECT_EQ("b4da60", model->component("component2")->variable(0)->id());
    EXPECT_EQ("b4da61", model->encapsulationId());

    auto connection2 = libcellml::VariablePair::create(
        model->component("component2")->variable("variable1")->equivalentVariable(0),
        model->component("component2")->variable("variable1"));
    auto mapping2 = libcellml::VariablePair::create(
        model->component("component4")->variable("variable2")->equivalentVariable(0),
        model->component("component4")->variable("variable2"));

    auto const &itemConnection2 = connection2;
    auto const &itemMapVariables2 = mapping2;

    EXPECT_EQ("b4da62", annotator->assignId(itemConnection2, libcellml::CellmlElementType::CONNECTION));
    EXPECT_EQ("b4da62", libcellml::Variable::equivalenceConnectionId(connection2->variable1(), connection2->variable2()));

    EXPECT_EQ("b4da63", annotator->assignId(itemMapVariables2));
    EXPECT_EQ("b4da63", libcellml::Variable::equivalenceMappingId(mapping2->variable1(), mapping2->variable2()));
}